

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O1

Fxch_Man_t * Fxch_ManAlloc(Vec_Wec_t *vCubes)

{
  uint uVar1;
  Fxch_Man_t *pFVar2;
  Hsh_VecMan_t *pHVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Flt_t *pVVar6;
  float *pfVar7;
  Vec_Wec_t *pVVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
  pFVar2 = (Fxch_Man_t *)calloc(1,0xd8);
  pFVar2->vCubes = vCubes;
  pFVar2->nCubesInit = vCubes->nSize;
  pHVar3 = (Hsh_VecMan_t *)calloc(1,0x48);
  uVar11 = 0x3ff;
  while( true ) {
    do {
      uVar10 = uVar11;
      uVar11 = uVar10 + 1;
    } while ((uVar10 & 1) != 0);
    if (uVar11 < 9) break;
    iVar9 = 5;
    while (uVar11 % (iVar9 - 2U) != 0) {
      uVar1 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar11 < uVar1) goto LAB_0048f491;
    }
  }
LAB_0048f491:
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0xe < uVar10) {
    uVar1 = uVar11;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = uVar1;
  piVar5 = (int *)malloc((long)(int)uVar1 << 2);
  pVVar4->pArray = piVar5;
  pVVar4->nSize = uVar11;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0xff,(long)(int)uVar11 << 2);
  }
  pHVar3->vTable = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x4000);
  pVVar4->pArray = piVar5;
  pHVar3->vData = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x400;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x1000);
  pVVar4->pArray = piVar5;
  pHVar3->vMap = pVVar4;
  pFVar2->pDivHash = pHVar3;
  pVVar6 = (Vec_Flt_t *)malloc(0x10);
  pVVar6->nCap = 0x400;
  pVVar6->nSize = 0;
  pfVar7 = (float *)malloc(0x1000);
  pVVar6->pArray = pfVar7;
  pFVar2->vDivWeights = pVVar6;
  pVVar8 = (Vec_Wec_t *)malloc(0x10);
  pVVar8->nCap = 0x400;
  pVVar8->nSize = 0;
  pVVar4 = (Vec_Int_t *)calloc(0x400,0x10);
  pVVar8->pArray = pVVar4;
  pFVar2->vDivCubePairs = pVVar8;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x10;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x40);
  pVVar4->pArray = piVar5;
  pFVar2->vCubeFree = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x10;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x40);
  pVVar4->pArray = piVar5;
  pFVar2->vDiv = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x80;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x200);
  pVVar4->pArray = piVar5;
  pFVar2->vCubesS = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x80;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x200);
  pVVar4->pArray = piVar5;
  pFVar2->vPairs = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x40;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x100);
  pVVar4->pArray = piVar5;
  pFVar2->vCubesToUpdate = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x40;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x100);
  pVVar4->pArray = piVar5;
  pFVar2->vCubesToRemove = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x40;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x100);
  pVVar4->pArray = piVar5;
  pFVar2->vSCC = pVVar4;
  return pFVar2;
}

Assistant:

Fxch_Man_t* Fxch_ManAlloc( Vec_Wec_t* vCubes )
{
    Fxch_Man_t* pFxchMan = ABC_CALLOC( Fxch_Man_t, 1 );

    pFxchMan->vCubes = vCubes;
    pFxchMan->nCubesInit = Vec_WecSize( vCubes );

    pFxchMan->pDivHash = Hsh_VecManStart( 1024 );
    pFxchMan->vDivWeights = Vec_FltAlloc( 1024 );
    pFxchMan->vDivCubePairs = Vec_WecAlloc( 1024 );

    pFxchMan->vCubeFree = Vec_IntAlloc( 4 );
    pFxchMan->vDiv = Vec_IntAlloc( 4 );

    pFxchMan->vCubesS = Vec_IntAlloc( 128 );
    pFxchMan->vPairs = Vec_IntAlloc( 128 );
    pFxchMan->vCubesToUpdate = Vec_IntAlloc( 64 );
    pFxchMan->vCubesToRemove = Vec_IntAlloc( 64 );
    pFxchMan->vSCC = Vec_IntAlloc( 64 );

    return pFxchMan;
}